

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O0

DNN_NUMERIC
tfs::localTest2d(Dnn *dnn,vector<double,_std::allocator<double>_> *data,
                vector<long,_std::allocator<long>_> *label)

{
  Matrix *this;
  double *pdVar1;
  long *plVar2;
  size_type sVar3;
  DnnTrainer *this_00;
  long lVar4;
  vector<long,_std::allocator<long>_> *in_RDX;
  undefined1 auVar5 [16];
  DNN_NUMERIC *inPtr;
  uint ii;
  DNN_NUMERIC average_loss;
  unsigned_long count;
  DNN_NUMERIC TARGET_LOSS;
  uint MAX_ITERATION;
  DNN_INTEGER *ePtr;
  unsigned_long DATA_COUNT;
  DNN_INTEGER *lPtr;
  DNN_NUMERIC *dPtr;
  Matrix *input;
  DnnTrainerAdaDelta trainer;
  Dnn *in_stack_fffffffffffffeb8;
  DnnTrainerAdaDelta *in_stack_fffffffffffffec0;
  uint local_114;
  double local_110;
  long *local_e0;
  double *local_d8;
  double local_8;
  
  DnnTrainerAdaDelta::DnnTrainerAdaDelta(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  DnnTrainer::learningRate((DnnTrainer *)&stack0xffffffffffffff50,0.01);
  DnnTrainer::momentum((DnnTrainer *)&stack0xffffffffffffff50,0.1);
  DnnTrainer::batchSize((DnnTrainer *)&stack0xffffffffffffff50,10);
  DnnTrainer::l2Decay((DnnTrainer *)&stack0xffffffffffffff50,0.001);
  this = DnnTrainer::getMatrixInput(&in_stack_fffffffffffffec0->super_DnnTrainer);
  if (this == (Matrix *)0x0) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                   ,"localTest2d",0x75,"Unable to obtain input matrix.");
    local_8 = 0.0;
  }
  else {
    pdVar1 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x117551);
    if (pdVar1 == (double *)0x0) {
      report_problem("Error",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                     ,"localTest2d",0x7a,"Unable to obtain input data.");
      local_8 = 0.0;
    }
    else {
      plVar2 = std::vector<long,_std::allocator<long>_>::data
                         ((vector<long,_std::allocator<long>_> *)0x1175ae);
      if (plVar2 == (long *)0x0) {
        report_problem("Error",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                       ,"localTest2d",0x7f,"Unable to obtain input labels.");
        local_8 = 0.0;
      }
      else {
        sVar3 = std::vector<long,_std::allocator<long>_>::size(in_RDX);
        if (sVar3 == 0) {
          report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testIO.cpp"
                         ,"localTest2d",0x84,"Label data size < 1");
          local_8 = 0.0;
        }
        else {
          do {
            local_110 = 0.0;
            for (local_114 = 0; local_114 < 200; local_114 = local_114 + 1) {
              local_d8 = std::vector<double,_std::allocator<double>_>::data
                                   ((vector<double,_std::allocator<double>_> *)0x1176d3);
              local_e0 = std::vector<long,_std::allocator<long>_>::data
                                   ((vector<long,_std::allocator<long>_> *)0x1176e5);
              while (local_e0 < plVar2 + sVar3) {
                this_00 = (DnnTrainer *)TMatrix<double>::data(this);
                pdVar1 = local_d8 + 1;
                this_00->_vptr_DnnTrainer = (_func_int **)*local_d8;
                local_d8 = local_d8 + 2;
                this_00->m_dnn = (Dnn *)*pdVar1;
                local_e0 = local_e0 + 1;
                in_stack_fffffffffffffec0 =
                     (DnnTrainerAdaDelta *)
                     DnnTrainer::train(this_00,(DNN_INTEGER)in_stack_fffffffffffffec0);
                local_110 = (double)in_stack_fffffffffffffec0 + local_110;
              }
            }
            lVar4 = sVar3 * 200;
            auVar5._8_4_ = (int)((ulong)lVar4 >> 0x20);
            auVar5._0_8_ = lVar4;
            auVar5._12_4_ = 0x45300000;
            local_8 = local_110 /
                      ((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
          } while (0.05 < local_8);
        }
      }
    }
  }
  DnnTrainerAdaDelta::~DnnTrainerAdaDelta((DnnTrainerAdaDelta *)0x117831);
  return local_8;
}

Assistant:

DNN_NUMERIC
    localTest2d( Dnn &dnn, std::vector< DNN_NUMERIC > &data, std::vector< DNN_INTEGER > &label ) {
        DnnTrainerAdaDelta trainer( &dnn );
        trainer.learningRate( 0.01  );
        trainer.momentum(     0.1   );
        trainer.batchSize(   10     );
        trainer.l2Decay(      0.001 );
        
        Matrix *input = trainer.getMatrixInput();       // get the input matrix: x,y pair Matrix( 1, 1, 2 )
        if( input == 0 ) {
            log_error( "Unable to obtain input matrix." );
            return 0.0;
        }
        const DNN_NUMERIC *dPtr = data.data();
        if( dPtr == 0 ) {
            log_error( "Unable to obtain input data." );
            return 0.0;
        }
        const DNN_INTEGER *lPtr = label.data();
        if( lPtr == 0 ) {
            log_error( "Unable to obtain input labels." );
            return 0.0;
        }
        const unsigned long DATA_COUNT = label.size();
        if( DATA_COUNT < 1 ) {
            log_error( "Label data size < 1" );
            return 0.0;
        }
        const DNN_INTEGER *ePtr = lPtr + DATA_COUNT;
        
        const unsigned int MAX_ITERATION = 200;
        const DNN_NUMERIC   TARGET_LOSS  = 0.05;
        unsigned long count = 0;
        DNN_NUMERIC average_loss = 0.0;
        do {
            count++;
            average_loss = 0.0;
            for( unsigned int ii = 0; ii < MAX_ITERATION; ii++ ) {
                dPtr = data.data();
                lPtr = label.data();
                
                while( lPtr < ePtr ) {
                    DNN_NUMERIC *inPtr = input->data();
                    *inPtr++ = *dPtr++;     // x
                    *inPtr   = *dPtr++;     // y
                    average_loss += trainer.train( *lPtr++ );
                }
            }
            average_loss /= DATA_COUNT * MAX_ITERATION;
        } while( average_loss > TARGET_LOSS );
//        log_info( "Average loss = %f/%f. Count = %lu", average_loss, TARGET_LOSS, count );
        return average_loss;
    }